

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O0

int run_command(AP_CTX *ctx,int *exit_code)

{
  uint uVar1;
  int local_1c;
  int rc_os;
  int rc;
  int *exit_code_local;
  AP_CTX *ctx_local;
  
  local_1c = 0;
  if (ctx->simulate == '\0') {
    uVar1 = system(ctx->client_command);
    if (uVar1 == 0xffffffff) {
      ap_log(AP_LOG_LEVEL_ERROR,"(%s) Can not execute the shell for command \'%s\'\n",ctx->client_ip
             ,ctx->client_command);
      local_1c = 10;
    }
    else {
      uVar1 = (int)(uVar1 & 0xff00) >> 8;
      if (uVar1 == 0x7f) {
        ap_log(AP_LOG_LEVEL_ERROR,
               "(%s) Can not execute command, shell was executed, but the command inside the shell wasn\'t \'%s\'\n"
               ,ctx->client_ip,ctx->client_command);
        local_1c = 10;
      }
      else {
        ap_log(AP_LOG_LEVEL_ALLOWED_COMMAND,
               "(%s) Successfully executed command \'%s\', exit code \'%d\'\n",ctx->client_ip,
               ctx->client_command,(ulong)uVar1);
        *exit_code = uVar1;
      }
    }
  }
  else {
    ap_log(AP_LOG_LEVEL_ALLOWED_COMMAND,
           "(%s) Successfully executed command \'%s\', exit code \'%d\'\n",ctx->client_ip,
           ctx->client_command,0);
    *exit_code = 0;
  }
  return local_1c;
}

Assistant:

static int run_command (AP_CTX *ctx, int *exit_code)
{
	int			rc			= AP_NO_ERROR;
	int			rc_os;

	if (ctx->simulate)
	{
		rc_os = 0;

		ap_allowed ("(%s) Successfully executed command '%s', exit code '%d'\n", ctx->client_ip, ctx->client_command, rc_os);

		*exit_code = rc_os;

		goto finish;
	}

	rc_os = system (ctx->client_command);
	switch (rc_os)
	{
		case -1:
		{
			ap_error ("(%s) Can not execute the shell for command '%s'\n", ctx->client_ip, ctx->client_command);
			rc = AP_ERROR_EXECUTE_COMMAND;

			goto finish;

			break;
		}

		default:
		{
#			if !defined (_WIN32)
			rc_os = WEXITSTATUS (rc_os);
#			endif

			if (rc_os == 127)
			{
				ap_error ("(%s) Can not execute command, shell was executed, but the command inside the shell wasn't '%s'\n", ctx->client_ip, ctx->client_command);
				rc = AP_ERROR_EXECUTE_COMMAND;

				goto finish;
			}
			else
			{
				ap_allowed ("(%s) Successfully executed command '%s', exit code '%d'\n", ctx->client_ip, ctx->client_command, rc_os);

				*exit_code = rc_os;
			}

			break;
		}
	}

finish:
	return rc;
}